

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O2

void __thiscall
QCommandLineOption::setDefaultValues(QCommandLineOption *this,QStringList *defaultValues)

{
  QCommandLineOptionPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QCommandLineOptionPrivate>::operator->(&this->d);
  QArrayDataPointer<QString>::operator=(&(pQVar1->defaultValues).d,&defaultValues->d);
  return;
}

Assistant:

void QCommandLineOption::setDefaultValues(const QStringList &defaultValues)
{
    d->defaultValues = defaultValues;
}